

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::ConvertCluster
          (FBXConverter *this,vector<aiBone_*,_std::allocator<aiBone_*>_> *bones,Model *param_2,
          Cluster *cl,vector<unsigned_long,_std::allocator<unsigned_long>_> *out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *index_out_indices,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *count_out_indices,
          aiMatrix4x4 *node_global_transform)

{
  pointer puVar1;
  pointer puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  aiBone *paVar18;
  ulong uVar19;
  aiVertexWeight *__s;
  FBXConverter *this_00;
  unsigned_long uVar20;
  ulong uVar21;
  unsigned_long uVar22;
  long lVar23;
  bool bVar24;
  aiBone *bone;
  pointer local_80;
  aiMatrix4x4t<float> temp;
  
  this_00 = (FBXConverter *)&bone;
  paVar18 = (aiBone *)operator_new(0x450);
  aiBone::aiBone(paVar18);
  bone = paVar18;
  std::vector<aiBone_*,_std::allocator<aiBone_*>_>::push_back(bones,&bone);
  FixNodeName((string *)&temp,this_00,&(cl->node->super_Object).name);
  paVar18 = bone;
  if ((ulong)temp._8_8_ < 0x400) {
    (bone->mName).length = (ai_uint32)temp.a3;
    memcpy((bone->mName).data,(void *)temp._0_8_,temp._8_8_);
    (paVar18->mName).data[temp._8_8_] = '\0';
  }
  std::__cxx11::string::~string((string *)&temp);
  fVar14 = (cl->transformLink).a1;
  fVar15 = (cl->transformLink).a2;
  fVar16 = (cl->transformLink).a3;
  fVar17 = (cl->transformLink).a4;
  fVar10 = (cl->transformLink).b1;
  fVar11 = (cl->transformLink).b2;
  fVar12 = (cl->transformLink).b3;
  fVar13 = (cl->transformLink).b4;
  fVar6 = (cl->transformLink).c1;
  fVar7 = (cl->transformLink).c2;
  fVar8 = (cl->transformLink).c3;
  fVar9 = (cl->transformLink).c4;
  fVar3 = (cl->transformLink).d2;
  fVar4 = (cl->transformLink).d3;
  fVar5 = (cl->transformLink).d4;
  (bone->mOffsetMatrix).d1 = (cl->transformLink).d1;
  (bone->mOffsetMatrix).d2 = fVar3;
  (bone->mOffsetMatrix).d3 = fVar4;
  (bone->mOffsetMatrix).d4 = fVar5;
  (bone->mOffsetMatrix).c1 = fVar6;
  (bone->mOffsetMatrix).c2 = fVar7;
  (bone->mOffsetMatrix).c3 = fVar8;
  (bone->mOffsetMatrix).c4 = fVar9;
  (bone->mOffsetMatrix).b1 = fVar10;
  (bone->mOffsetMatrix).b2 = fVar11;
  (bone->mOffsetMatrix).b3 = fVar12;
  (bone->mOffsetMatrix).b4 = fVar13;
  (bone->mOffsetMatrix).a1 = fVar14;
  (bone->mOffsetMatrix).a2 = fVar15;
  (bone->mOffsetMatrix).a3 = fVar16;
  (bone->mOffsetMatrix).a4 = fVar17;
  aiMatrix4x4t<float>::Inverse(&bone->mOffsetMatrix);
  temp.a1 = (bone->mOffsetMatrix).a1;
  temp.a2 = (bone->mOffsetMatrix).a2;
  temp.a3 = (bone->mOffsetMatrix).a3;
  temp.a4 = (bone->mOffsetMatrix).a4;
  temp.b1 = (bone->mOffsetMatrix).b1;
  temp.b2 = (bone->mOffsetMatrix).b2;
  temp.b3 = (bone->mOffsetMatrix).b3;
  temp.b4 = (bone->mOffsetMatrix).b4;
  temp.c1 = (bone->mOffsetMatrix).c1;
  temp.c2 = (bone->mOffsetMatrix).c2;
  temp.c3 = (bone->mOffsetMatrix).c3;
  temp.c4 = (bone->mOffsetMatrix).c4;
  temp.d1 = (bone->mOffsetMatrix).d1;
  temp.d2 = (bone->mOffsetMatrix).d2;
  temp.d3 = (bone->mOffsetMatrix).d3;
  temp.d4 = (bone->mOffsetMatrix).d4;
  aiMatrix4x4t<float>::operator*=(&temp,node_global_transform);
  paVar18 = bone;
  (bone->mOffsetMatrix).a1 = temp.a1;
  (bone->mOffsetMatrix).a2 = temp.a2;
  (bone->mOffsetMatrix).a3 = temp.a3;
  (bone->mOffsetMatrix).a4 = temp.a4;
  (bone->mOffsetMatrix).b1 = temp.b1;
  (bone->mOffsetMatrix).b2 = temp.b2;
  (bone->mOffsetMatrix).b3 = temp.b3;
  (bone->mOffsetMatrix).b4 = temp.b4;
  (bone->mOffsetMatrix).c1 = temp.c1;
  (bone->mOffsetMatrix).c2 = temp.c2;
  (bone->mOffsetMatrix).c3 = temp.c3;
  (bone->mOffsetMatrix).c4 = temp.c4;
  (bone->mOffsetMatrix).d1 = temp.d1;
  (bone->mOffsetMatrix).d2 = temp.d2;
  (bone->mOffsetMatrix).d3 = temp.d3;
  (bone->mOffsetMatrix).d4 = temp.d4;
  bone->mNumWeights =
       (uint)((ulong)((long)(out_indices->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(out_indices->
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_80 = (pointer)(out_indices->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_start;
  puVar1 = (out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar19 = (long)puVar1 - (long)local_80;
  uVar21 = 0xffffffffffffffff;
  if (-1 < (long)uVar19) {
    uVar21 = uVar19;
  }
  __s = (aiVertexWeight *)operator_new__(uVar21);
  lVar23 = (long)puVar1 - (long)local_80;
  if (lVar23 != 0) {
    memset(__s,0,(lVar23 - 8U & 0xfffffffffffffff8) + 8);
  }
  paVar18->mWeights = __s;
  puVar1 = (index_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (index_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar23 = 0; lVar23 != (long)puVar1 - (long)puVar2 >> 3; lVar23 = lVar23 + 1) {
    uVar20 = (index_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar23];
    if (uVar20 != 0xffffffffffffffff) {
      uVar22 = (count_out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar23];
      while (bVar24 = uVar22 != 0, uVar22 = uVar22 - 1, bVar24) {
        __s->mVertexId =
             (uint)(out_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar20];
        __s->mWeight = (cl->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
        __s = __s + 1;
        uVar20 = uVar20 + 1;
      }
    }
  }
  return;
}

Assistant:

void FBXConverter::ConvertCluster(std::vector<aiBone*>& bones, const Model& /*model*/, const Cluster& cl,
            std::vector<size_t>& out_indices,
            std::vector<size_t>& index_out_indices,
            std::vector<size_t>& count_out_indices,
            const aiMatrix4x4& node_global_transform)
        {

            aiBone* const bone = new aiBone();
            bones.push_back(bone);

            bone->mName = FixNodeName(cl.TargetNode()->Name());

            bone->mOffsetMatrix = cl.TransformLink();
            bone->mOffsetMatrix.Inverse();

            bone->mOffsetMatrix = bone->mOffsetMatrix * node_global_transform;

            bone->mNumWeights = static_cast<unsigned int>(out_indices.size());
            aiVertexWeight* cursor = bone->mWeights = new aiVertexWeight[out_indices.size()];

            const size_t no_index_sentinel = std::numeric_limits<size_t>::max();
            const WeightArray& weights = cl.GetWeights();

            const size_t c = index_out_indices.size();
            for (size_t i = 0; i < c; ++i) {
                const size_t index_index = index_out_indices[i];

                if (index_index == no_index_sentinel) {
                    continue;
                }

                const size_t cc = count_out_indices[i];
                for (size_t j = 0; j < cc; ++j) {
                    aiVertexWeight& out_weight = *cursor++;

                    out_weight.mVertexId = static_cast<unsigned int>(out_indices[index_index + j]);
                    out_weight.mWeight = weights[i];
                }
            }
        }